

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::includeFile(Forth *this)

{
  uint uVar1;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string fileContent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream inStrStream;
  ostream local_198 [376];
  
  requireDStackDepth(this,1,"INCLUDE-FILE");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inStrStream,"INCLUDE-FILE",(allocator<char> *)&fileContent);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar1,(errorCodes)&inStrStream);
  std::__cxx11::string::~string((string *)&inStrStream);
  fileContent._M_dataplus._M_p = (pointer)&fileContent.field_2;
  fileContent._M_string_length = 0;
  fileContent.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&inStrStream);
  std::ostream::operator<<
            (local_198,
             (streambuf *)
             (f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x18));
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&fileContent,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  SaveInput(this);
  this->sourceid = uVar1;
  setDataCell(this,this->VarOffsetBlkAddress,0);
  SetInput(this,&fileContent);
  this->InterpretState = InterpretSource;
  closeFile(this);
  ForthStack<unsigned_int>::pop(&this->dStack);
  std::__cxx11::stringstream::~stringstream((stringstream *)&inStrStream);
  std::__cxx11::string::~string((string *)&fileContent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void includeFile() {
	REQUIRE_DSTACK_DEPTH(1, "INCLUDE-FILE");

	auto h = (dStack.getTop()); // do not delete handler from stack to close file after read
	auto f = GetFileHandle(h, "INCLUDE-FILE",errorReadFile);
	/*
	std::string line;
	while (std::getline(*f, line)) {
		auto addr = PutStringToEndOfDataSpace(line);
		push(CELL(addr));
		push(static_cast<Cell>(line.length()));
		evaluate(); //@bug - should move evaluate outside of this procedure
	}
	*/
	std::string fileContent{};
	std::stringstream inStrStream{};
	inStrStream << (*f).rdbuf();   // read the file
	fileContent = inStrStream.str(); //
	SaveInput();
	setSourceId(h);
	setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
	SetInput(fileContent);
	InterpretState = InterpretSource;
	// must close file according to specification
	closeFile();
	pop(); // discard error code
}